

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

iterator __thiscall
first_fit_heap<16UL>::free_list_container::try_merge_back(free_list_container *this,iterator it)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  ulong *puVar4;
  
  uVar3 = ((it.block)->super_header_used).raw & 0x3fffffffffffffff;
  puVar4 = (ulong *)((long)&(it.block)->next_ + uVar3);
  iVar2 = (*this->mem->_vptr_memory[4])();
  if ((puVar4 < (ulong *)CONCAT44(extraout_var,iVar2)) &&
     (uVar1 = *puVar4, (uVar1 & 0x4000000000000000) != 0)) {
    (it.block)->next_ = *(header_free **)((long)&it.block[1].super_header_used.canary + uVar3);
    header_used::size(&(it.block)->super_header_used,
                      (uVar1 & 0x3fffffffffffffff) +
                      (((it.block)->super_header_used).raw & 0x3fffffffffffffff) + 0x10);
    uVar3 = ((it.block)->super_header_used).raw & 0x3fffffffffffffff;
    *(ulong *)((long)&((it.block)->super_header_used).canary + uVar3) = uVar3;
  }
  return (iterator)it.block;
}

Assistant:

iterator try_merge_back(iterator it)
        {
            auto *following = (*it)->following_block(mem);

            if (following and following->is_free()) {
                auto *following_free = static_cast<header_free*>(following);
                (*it)->next(following_free->next());
                (*it)->size((*it)->size() + following_free->size() + sizeof(header_used));
                (*it)->update_footer();
            }

            return it;
        }